

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

string * __thiscall PhyloTree::getNewick_abi_cxx11_(PhyloTree *this,bool branchLengths)

{
  bool bVar1;
  undefined1 uVar2;
  Bipartition *this_00;
  ulong uVar3;
  size_type sVar4;
  double dVar5;
  reference pvVar6;
  byte in_DL;
  void *__child_stack;
  long in_RSI;
  string *in_RDI;
  void *in_R8;
  reference rVar7;
  size_t i_4;
  int i_3;
  Bipartition allLeaves;
  size_t i_2;
  size_t k;
  string str1;
  size_t i_1;
  size_t pos;
  value_type minEdge;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesLeft;
  size_t i;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> corrEdges;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strPieces;
  string *newickString;
  PhyloTreeEdge *in_stack_fffffffffffff9c8;
  undefined7 in_stack_fffffffffffff9d0;
  byte in_stack_fffffffffffff9d7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff9e0;
  size_t in_stack_fffffffffffff9e8;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_fffffffffffff9f0;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  Bipartition *in_stack_fffffffffffffa08;
  Bipartition *other;
  Bipartition *in_stack_fffffffffffffa10;
  string *in_stack_fffffffffffffa18;
  string *s;
  Bipartition *in_stack_fffffffffffffa20;
  ulong in_stack_fffffffffffffa48;
  undefined6 in_stack_fffffffffffffa50;
  byte in_stack_fffffffffffffa56;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  string *this_01;
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [64];
  reference local_498;
  double in_stack_fffffffffffffb78;
  double dVar8;
  double d;
  string local_480 [32];
  int local_460;
  undefined1 local_45b [2];
  undefined1 local_459 [73];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [64];
  reference local_310;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_300;
  ulong local_2e0;
  string local_2b8 [32];
  ulong local_298;
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [32];
  PhyloTreeEdge local_240;
  ulong local_1f8;
  size_type local_1f0;
  PhyloTreeEdge local_1e8;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_1a0;
  undefined4 local_188;
  allocator local_181;
  string local_180 [112];
  string local_110 [32];
  string local_f0 [32];
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d0;
  byte local_11;
  
  local_11 = in_DL & 1;
  this_01 = in_RDI;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x16dbd2);
  std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::deque
            ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x16dbdf);
  bVar1 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::empty
                    ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     in_stack_fffffffffffff9e0);
  if (bVar1) {
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[2]>
              ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
               (char (*) [2])in_stack_fffffffffffff9c8);
    local_d0 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
    while (__x = local_d0,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(in_RSI + 0x38)),
          __x < (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(sVar4 - 1)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RSI + 0x38),(size_type)local_d0);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                  (value_type *)in_stack_fffffffffffff9c8);
      if ((local_11 & 1) != 0) {
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2]>
                  ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                   (char (*) [2])in_stack_fffffffffffff9c8);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x50),(size_type)local_d0);
        Tools::double_to_string_abi_cxx11_(in_stack_fffffffffffffb78);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                    (value_type *)in_stack_fffffffffffff9c8);
        std::__cxx11::string::~string(local_f0);
      }
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[2]>
                ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                 (char (*) [2])in_stack_fffffffffffff9c8);
      local_d0 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&(local_d0->
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Deque_impl_data._M_map + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                (value_type *)in_stack_fffffffffffff9c8);
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[2]>
              ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
               (char (*) [2])in_stack_fffffffffffff9c8);
    std::vector<double,_std::allocator<double>_>::back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
    Tools::double_to_string_abi_cxx11_(in_stack_fffffffffffffb78);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                (value_type *)in_stack_fffffffffffff9c8);
    std::__cxx11::string::~string(local_110);
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
               (char (*) [3])in_stack_fffffffffffff9c8);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01,__x);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"",&local_181);
    Tools::string_join((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff9d8,
                       (string *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffa20);
    local_188 = 1;
  }
  else {
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffa20,
               (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffa18);
    while( true ) {
      bVar1 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::empty
                        ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                         in_stack_fffffffffffff9e0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::front
                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                 CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
      PhyloTreeEdge::PhyloTreeEdge
                ((PhyloTreeEdge *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                 in_stack_fffffffffffff9c8);
      local_1f0 = 0;
      local_1f8 = 1;
      while( true ) {
        uVar3 = local_1f8;
        sVar4 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(&local_1a0);
        if (sVar4 <= uVar3) break;
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[](&local_1a0,local_1f8)
        ;
        bVar1 = Bipartition::contains(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        if (bVar1) {
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                    (&local_1a0,local_1f8);
          PhyloTreeEdge::operator=
                    ((PhyloTreeEdge *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                     in_stack_fffffffffffff9c8);
          local_1f0 = local_1f8;
        }
        local_1f8 = local_1f8 + 1;
      }
      Tools::vector_remove_element_at_index<PhyloTreeEdge>
                (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      PhyloTreeEdge::clone(&local_240,(__fn *)&local_1e8,__child_stack,(int)sVar4,in_R8);
      std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_front
                ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                 CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                 in_stack_fffffffffffff9c8);
      PhyloTreeEdge::~PhyloTreeEdge
                ((PhyloTreeEdge *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_260,"",&local_261);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                   (value_type *)in_stack_fffffffffffff9c8);
      std::__cxx11::string::~string(local_260);
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_288,"(",&local_289);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      local_298 = 1;
      while( true ) {
        uVar3 = local_298;
        sVar4 = std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
                          ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x16e1b0);
        if (sVar4 <= uVar3) break;
        std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                  ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                   CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                   (size_type)in_stack_fffffffffffff9c8);
        uVar2 = Bipartition::contains(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        if ((bool)uVar2) {
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                       (size_type)in_stack_fffffffffffff9c8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
                         (char *)in_stack_fffffffffffff9f0);
          std::__cxx11::string::operator+=(local_288,local_2b8);
          std::__cxx11::string::~string(local_2b8);
          std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                    ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                     (size_type)in_stack_fffffffffffff9c8);
          Bipartition::andNot(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
          Tools::deque_remove_element_at_index<std::__cxx11::string>
                    ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa56,in_stack_fffffffffffffa50)
                                ),in_stack_fffffffffffffa48);
          Tools::deque_remove_element_at_index<PhyloTreeEdge>
                    ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa56,in_stack_fffffffffffffa50)),
                     in_stack_fffffffffffffa48);
        }
        else {
          local_298 = local_298 + 1;
        }
      }
      Bipartition::getPartition(&in_stack_fffffffffffff9c8->super_Bipartition);
      bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x16e3bf);
      in_stack_fffffffffffffa56 = bVar1 ^ 0xff;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
      if ((in_stack_fffffffffffffa56 & 1) != 0) {
        local_2e0 = 0;
        while( true ) {
          in_stack_fffffffffffffa48 = local_2e0;
          Bipartition::getPartition(&in_stack_fffffffffffff9c8->super_Bipartition);
          sVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size
                            (&local_300);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
          if (sVar4 <= in_stack_fffffffffffffa48) break;
          Bipartition::getPartition(&in_stack_fffffffffffff9c8->super_Bipartition);
          rVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (in_stack_fffffffffffff9e0,(size_type)in_stack_fffffffffffff9d8);
          local_310 = rVar7;
          bVar1 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_310);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
          if (bVar1) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)(in_RSI + 0x38),local_2e0);
            std::__cxx11::string::operator+=(local_288,(string *)pvVar6);
            if ((local_11 & 1) != 0) {
              std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x50),local_2e0);
              Tools::double_to_string_abi_cxx11_(in_stack_fffffffffffffb78);
              std::operator+((char *)in_stack_fffffffffffff9d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
              std::__cxx11::string::operator+=(local_288,local_350);
              std::__cxx11::string::~string(local_350);
              std::__cxx11::string::~string(local_370);
            }
            std::__cxx11::string::operator+=(local_288,",");
          }
          local_2e0 = local_2e0 + 1;
        }
      }
      std::__cxx11::string::string(local_3d0,local_288);
      std::__cxx11::string::length();
      Tools::substring(in_stack_fffffffffffffa18,(size_t)in_stack_fffffffffffffa10,
                       (size_t)in_stack_fffffffffffffa08);
      std::operator+(in_stack_fffffffffffff9d8,
                     (char *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
      std::__cxx11::string::operator=(local_288,local_390);
      std::__cxx11::string::~string(local_390);
      std::__cxx11::string::~string(local_3b0);
      std::__cxx11::string::~string(local_3d0);
      if ((local_11 & 1) != 0) {
        in_stack_fffffffffffffa20 = (Bipartition *)PhyloTreeEdge::getLength(&local_1e8);
        Tools::double_to_string_abi_cxx11_(in_stack_fffffffffffffb78);
        std::operator+((char *)in_stack_fffffffffffff9d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
        std::__cxx11::string::operator+=(local_288,local_3f0);
        std::__cxx11::string::~string(local_3f0);
        std::__cxx11::string::~string(local_410);
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                   (value_type *)in_stack_fffffffffffff9c8);
      std::__cxx11::string::~string(local_288);
      PhyloTreeEdge::~PhyloTreeEdge
                ((PhyloTreeEdge *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
    }
    this_00 = (Bipartition *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RSI + 0x38));
    s = (string *)local_459;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_459 + 1),(ulong)this_00,'1',(allocator *)s);
    Bipartition::Bipartition(in_stack_fffffffffffffa20,s);
    std::__cxx11::string::~string((string *)(local_459 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_459);
    local_45b[1] = 0;
    other = (Bipartition *)local_45b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this_01,"(",(allocator *)other);
    std::allocator<char>::~allocator((allocator<char> *)local_45b);
    local_460 = 0;
    while( true ) {
      uVar3 = (ulong)local_460;
      sVar4 = std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
                        ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x16e910);
      if (sVar4 <= uVar3) break;
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                   (size_type)in_stack_fffffffffffff9c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
                     (char *)in_stack_fffffffffffff9f0);
      std::__cxx11::string::operator+=((string *)this_01,local_480);
      std::__cxx11::string::~string(local_480);
      std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                 CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                 (size_type)in_stack_fffffffffffff9c8);
      Bipartition::andNot(this_00,other);
      local_460 = local_460 + 1;
    }
    bVar1 = Bipartition::isEmpty
                      ((Bipartition *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0))
    ;
    rVar7.m_mask = (block_type)in_stack_fffffffffffff9d8;
    rVar7.m_block = (block_type *)in_stack_fffffffffffff9e0;
    if (!bVar1) {
      dVar8 = 0.0;
      while( true ) {
        d = dVar8;
        dVar5 = (double)Bipartition::size((Bipartition *)0x16eaa7);
        if ((ulong)dVar5 <= (ulong)dVar8) break;
        Bipartition::getPartition(&in_stack_fffffffffffff9c8->super_Bipartition);
        rVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           rVar7.m_block,rVar7.m_mask);
        local_498 = rVar7;
        in_stack_fffffffffffff9d7 =
             boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_498);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
        if ((in_stack_fffffffffffff9d7 & 1) != 0) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(in_RSI + 0x38),(size_type)d);
          std::__cxx11::string::operator+=((string *)this_01,(string *)pvVar6);
          if ((local_11 & 1) != 0) {
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x50),(size_type)d);
            Tools::double_to_string_abi_cxx11_(d);
            std::operator+((char *)rVar7.m_mask,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
            std::__cxx11::string::operator+=((string *)this_01,local_4d8);
            std::__cxx11::string::~string(local_4d8);
            std::__cxx11::string::~string(local_4f8);
          }
          std::__cxx11::string::operator+=((string *)this_01,",");
        }
        dVar8 = (double)((long)d + 1);
      }
    }
    std::__cxx11::string::string(local_558,(string *)this_01);
    std::__cxx11::string::length();
    Tools::substring(s,(size_t)this_00,(size_t)other);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar7.m_mask
                   ,(char *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
    std::__cxx11::string::operator=((string *)this_01,local_518);
    std::__cxx11::string::~string(local_518);
    std::__cxx11::string::~string(local_538);
    std::__cxx11::string::~string(local_558);
    local_188 = 1;
    local_45b[1] = 1;
    Bipartition::~Bipartition((Bipartition *)0x16edb8);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)rVar7.m_block);
  }
  std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~deque
            ((deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffa20);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffa20);
  return in_RDI;
}

Assistant:

string PhyloTree::getNewick(bool branchLengths) {
    deque<string> strPieces;
    deque<PhyloTreeEdge> corrEdges;

    if (edges.empty()) // star-tree
    {
        strPieces.emplace_back("(");
        for (size_t i = 0; i < leaf2NumMap.size() - 1; ++i) {
            strPieces.push_back(leaf2NumMap[i]);
            if (branchLengths) {
                strPieces.emplace_back(":");
                strPieces.push_back(Tools::double_to_string(leafEdgeLengths[i]));
            }
            strPieces.emplace_back(",");
        }
        strPieces.push_back(leaf2NumMap.back());
        strPieces.emplace_back(":");
        strPieces.push_back(Tools::double_to_string(leafEdgeLengths.back()));
        strPieces.emplace_back(");");
        return Tools::string_join(strPieces, "");
    }

    vector<PhyloTreeEdge> edgesLeft(edges);

    while (!edgesLeft.empty()) {
        auto minEdge = edgesLeft.front();
        size_t pos = 0;
        for (size_t i = 1; i < edgesLeft.size(); ++i) {
            if (minEdge.contains(edgesLeft[i])) {
                minEdge = edgesLeft[i];
                pos = i;
            }
        }
        Tools::vector_remove_element_at_index(edgesLeft, pos);

        corrEdges.push_front(minEdge.clone());
        strPieces.push_front("");

        // now we have a min element.
        // Start its Newick string.
        string str1 = "(";

        // Since we are allowing degenerate trees, there could be an arbitrary number of such edges.
        size_t k = 1;
        while (k < corrEdges.size()) {
            if (minEdge.contains(corrEdges[k])) {
                // add it to the string
                str1 += strPieces[k] + ",";

                // remove each leaf in this split from minEdge
                minEdge.andNot(corrEdges[k]);

                // remove this split and its corresponding string from the vectors
                Tools::deque_remove_element_at_index(strPieces, k);
                Tools::deque_remove_element_at_index(corrEdges, k);
            } else {
                k++;
            }
        }

        // add all the elements still in minEdge (These are leaves that weren't already added as part of
        // a min split contained by minEdge.)
        if (!minEdge.getPartition().empty()) {
            for (size_t i = 0; i < minEdge.getPartition().size(); i++) {
                if (minEdge.getPartition()[i]) {
                    str1 += leaf2NumMap[i];
                    if (branchLengths) {
                        str1 += ":" + Tools::double_to_string(leafEdgeLengths[i]);
                    }
                    str1 += ",";
                }
            }
        }
        // remove the last , and add the bracket and minEdge length
        str1 = Tools::substring(str1, 0, str1.length() - 1) + ")";
        if (branchLengths) {
            str1 += ":" + Tools::double_to_string(minEdge.getLength());
        }
        // store str1
        strPieces.push_front(str1);
    }

    // now we need to combine all edges in corrEdges and all remaining leaves
    Bipartition allLeaves = Bipartition(string(leaf2NumMap.size(), '1'));

    string newickString = "(";
    // add all the string pieces we've accumulated
    for (int i = 0; i < corrEdges.size(); i++) {
        newickString += strPieces[i] + ",";
        allLeaves.andNot(corrEdges[i]);
    }
    // add all remaining leaves
    if (!allLeaves.isEmpty()) {
        for (size_t i = 0; i < allLeaves.size(); i++) {
            if ((allLeaves.getPartition())[i]) {
                newickString += leaf2NumMap[i];
                if (branchLengths) {
                    newickString += ":" + Tools::double_to_string(leafEdgeLengths[i]);
                }
                newickString += ",";
            }
        }
    }

    // remove the last ,
    newickString = Tools::substring(newickString, 0, newickString.length() - 1) + ");";
    return newickString;
}